

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

double __thiscall chrono::fea::ChElementTetraCorot_4_P::ComputeVolume(ChElementTetraCorot_4_P *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer psVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  Scalar SVar11;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  ChMatrixDynamic<> M;
  DenseStorage<double,__1,__1,__1,_1> local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double dStack_58;
  undefined1 local_48 [16];
  double dStack_38;
  undefined1 local_28 [16];
  double dStack_18;
  
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar5 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar2 = *(undefined1 (*) [16])(peVar4->pos).m_data;
  local_28 = vsubpd_avx(*(undefined1 (*) [16])(peVar5->pos).m_data,auVar2);
  dStack_58 = *(double *)((long)&peVar4->pos + 0x10);
  dStack_18 = *(double *)((long)&peVar5->pos + 0x10) - dStack_58;
  peVar4 = psVar3[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_48 = vsubpd_avx(*(undefined1 (*) [16])(peVar4->pos).m_data,auVar2);
  dStack_38 = *(double *)((long)&peVar4->pos + 0x10) - dStack_58;
  peVar4 = psVar3[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_68 = vsubpd_avx(*(undefined1 (*) [16])(peVar4->pos).m_data,auVar2);
  local_98.m_cols = 0;
  dStack_58 = *(double *)((long)&peVar4->pos + 0x10) - dStack_58;
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_98,9,3,3);
  if (local_98.m_rows < 0 && local_98.m_data != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if (0 < local_98.m_cols) {
    if (local_98.m_rows != 3) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                   );
    }
    auVar7 = vpbroadcastq_avx512vl();
    auVar7 = vpmullq_avx512vl(auVar7,_DAT_009840c0);
    auVar8._16_8_ = dStack_18;
    auVar8._0_16_ = local_28;
    auVar8._24_8_ = 0;
    vscatterqpd_avx512vl(ZEXT832(local_98.m_data) + auVar7 * (undefined1  [32])0x8,7,auVar8);
    if (1 < local_98.m_cols) {
      auVar7 = vpbroadcastq_avx512vl();
      auVar7 = vpmullq_avx512vl(auVar7,_DAT_009840c0);
      auVar9._16_8_ = dStack_38;
      auVar9._0_16_ = local_48;
      auVar9._24_8_ = 0;
      vscatterqpd_avx512vl
                (ZEXT832(local_98.m_data) + ZEXT832(8) + auVar7 * (undefined1  [32])0x8,7,auVar9);
      if (2 < local_98.m_cols) {
        auVar7 = vpbroadcastq_avx512vl();
        auVar7 = vpmullq_avx512vl(auVar7,_DAT_009840c0);
        uVar6 = CONCAT71((int7)((ulong)local_98.m_cols >> 8),7) & 0xffffffff;
        auVar10._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * local_68._8_8_;
        auVar10._0_8_ = (ulong)((byte)uVar6 & 1) * local_68._0_8_;
        auVar10._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * (long)dStack_58;
        auVar10._24_8_ = 0;
        vscatterqpd_avx512vl
                  (ZEXT832(local_98.m_data) + ZEXT832(0x10) + auVar7 * (undefined1  [32])0x8,uVar6,
                   auVar10);
        Eigen::internal::
        inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false,_false>::run
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_98);
        SVar11 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                           ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_98);
        auVar12._0_8_ = SVar11 / 6.0;
        auVar12._8_8_ = extraout_XMM0_Qb;
        auVar2._8_8_ = 0x7fffffffffffffff;
        auVar2._0_8_ = 0x7fffffffffffffff;
        local_78 = vandpd_avx512vl(auVar12,auVar2);
        dVar1 = (double)vmovlpd_avx(local_78);
        this->Volume = dVar1;
        if (local_98.m_data != (double *)0x0) {
          free((void *)local_98.m_data[-1]);
        }
        return (double)local_78._0_8_;
      }
    }
  }
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

double ChElementTetraCorot_4_P::ComputeVolume() {
    ChVector<> B1, C1, D1;
    B1.Sub(nodes[1]->GetPos(), nodes[0]->GetPos());
    C1.Sub(nodes[2]->GetPos(), nodes[0]->GetPos());
    D1.Sub(nodes[3]->GetPos(), nodes[0]->GetPos());
    ChMatrixDynamic<> M(3, 3);
    M.col(0) = B1.eigen();
    M.col(1) = C1.eigen();
    M.col(2) = D1.eigen();
    M.transposeInPlace();
    Volume = std::abs(M.determinant() / 6);
    return Volume;
}